

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UartSerial.cpp
# Opt level: O0

int __thiscall serial_wiring::UartSerial::_flush(UartSerial *this)

{
  int iVar1;
  UartSerial *this_local;
  
  if (this->_serial_file_descriptor == -1) {
    perror("UartSerial::flush - Invalid file descriptor");
  }
  else {
    iVar1 = tcdrain(this->_serial_file_descriptor);
    if (iVar1 != 0) {
      perror("UartSerial::flush - Unable to transmit data in the serial buffer");
    }
  }
  return 0;
}

Assistant:

int
UartSerial::_flush (
    void
) {
    if ( -1 == _serial_file_descriptor ) {
        ::perror("UartSerial::flush - Invalid file descriptor");
    } else if ( 0 != ::tcdrain(_serial_file_descriptor) ) {
        ::perror("UartSerial::flush - Unable to transmit data in the serial buffer");
    } else {
    }
    return 0;
}